

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall
asl::Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::dup
          (Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this,int __fd)

{
  Dic<asl::String> *pDVar1;
  KeyVal *in_RAX;
  KeyVal *p;
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> b;
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> local_18;
  
  p = this->_a;
  if (*(int *)&p[-1].value.super_Map<asl::String,_asl::String>.a._a != 1) {
    local_18._a = in_RAX;
    Array(&local_18,p,*(int *)((long)&p[-1].key.field_2 + 8));
    if (this->_a != local_18._a) {
      LOCK();
      pDVar1 = &this->_a[-1].value;
      *(int *)&(pDVar1->super_Map<asl::String,_asl::String>).a._a =
           *(int *)&(pDVar1->super_Map<asl::String,_asl::String>).a._a + -1;
      UNLOCK();
      if (*(int *)&(pDVar1->super_Map<asl::String,_asl::String>).a._a == 0) {
        free(this,p);
      }
      this->_a = (KeyVal *)local_18;
      LOCK();
      *(int *)&local_18._a[-1].value.super_Map<asl::String,_asl::String>.a._a =
           *(int *)&local_18._a[-1].value.super_Map<asl::String,_asl::String>.a._a + 1;
      UNLOCK();
    }
    ~Array(&local_18);
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}